

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgen.c
# Opt level: O0

int main(int ac,char **av)

{
  int iVar1;
  ulong uVar2;
  FILE *pFVar3;
  char *pcVar4;
  undefined8 *in_RSI;
  int in_EDI;
  char qname_2 [10];
  char qname_1 [10];
  char qname [10];
  char line [512];
  FILE *ifp;
  int i;
  char **in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  long (*palVar5) [22];
  char local_246 [10];
  char local_23c [10];
  char local_232 [10];
  char local_228 [36];
  int in_stack_fffffffffffffdfc;
  char *in_stack_fffffffffffffe00;
  uint local_14;
  
  prog = (char *)*in_RSI;
  flt_scale = 1.0;
  flags = 0;
  d_path = (char *)0x0;
  process_options((int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),in_stack_fffffffffffffda8);
  if ((flags & 0x10U) != 0) {
    fprintf(_stdout,"-- TPC %s Parameter Substitution (Version %d.%d.%d%s)\n",
            "SSB (Star Schema Benchmark)",1,0,0,"");
  }
  setup();
  if ((flags & 1U) == 0) {
    if ((flags & 0x400U) == 0) {
      uVar2 = time((time_t *)0x0);
      rndm = uVar2 & 0xffffffff;
    }
    if (rndm < 0) {
      rndm = rndm + 0x7fffffff;
    }
    Seed[0].value = rndm;
    for (local_14 = 1; (int)local_14 < 0x17; local_14 = local_14 + 1) {
      Seed[0].value = NextRand(Seed[0].value);
      Seed[(int)local_14].value = Seed[0].value;
    }
    printf("-- using %ld as a seed to the RNG\n",rndm);
  }
  else {
    printf("-- using default substitutions\n");
  }
  if ((flags & 0x1000U) != 0) {
    pFVar3 = fopen64(ifile,"r");
    if (pFVar3 == (FILE *)0x0) {
      fprintf(_stderr,"Open failed for %s at %s:%d\n",ifile,
              "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/qgen.c",
              0x1b3);
      exit(1);
    }
    while (pcVar4 = fgets(local_228,0x200,pFVar3), pcVar4 != (char *)0x0) {
      fprintf(_stdout,"%s",local_228);
    }
  }
  if (snum < 0) {
    if (_optind < in_EDI) {
      for (local_14 = _optind; (int)local_14 < in_EDI; local_14 = local_14 + 1) {
        qsub(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
      }
    }
    else {
      for (local_14 = 1; (int)local_14 < 0x17; local_14 = local_14 + 1) {
        sprintf(local_246,"%d",(ulong)local_14);
        qsub(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
      }
    }
  }
  else if (_optind < in_EDI) {
    for (local_14 = _optind; (int)local_14 < in_EDI; local_14 = local_14 + 1) {
      pcVar4 = local_232;
      palVar5 = permutation + snum % 0x29;
      iVar1 = atoi((char *)in_RSI[(int)local_14]);
      sprintf(pcVar4,"%ld",(*palVar5)[iVar1 + -1]);
      qsub(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    }
  }
  else {
    for (local_14 = 1; (int)local_14 < 0x17; local_14 = local_14 + 1) {
      sprintf(local_23c,"%ld",permutation[snum % 0x29][(int)(local_14 + -1)]);
      qsub(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    }
  }
  if ((flags & 0x2000U) != 0) {
    pFVar3 = fopen64(tfile,"r");
    if (pFVar3 == (FILE *)0x0) {
      fprintf(_stderr,"Open failed for %s at %s:%d\n",tfile,
              "/workspace/llm4binary/github/license_c_cmakelists/eyalroz[P]ssb-dbgen/src/qgen.c",
              0x1d7);
      exit(1);
    }
    while (pcVar4 = fgets(local_228,0x200,pFVar3), pcVar4 != (char *)0x0) {
      fprintf(_stdout,"%s",local_228);
    }
  }
  return 0;
}

Assistant:

int main(int ac, char **av)
{
    int i;
    FILE *ifp;
    char line[LINE_SIZE];

    prog = av[0];
    flt_scale = (double)1.0;
    flags = 0;
	d_path = NULL;
    process_options(ac, av);
    if (flags & VERBOSE)
        fprintf(ofp, 
	    "-- TPC %s Parameter Substitution (Version %d.%d.%d%s)\n",
            NAME, VERSION, RELEASE, MODIFICATION, PATCH);

    setup();

    if (!(flags & DFLT))        /* perturb the RNG */
	    {
	    if (!(flags & SEED))
            {
			/* Note:
			 * The multiplication by the process ID is a change in ssb-dbgen relative to TPC-H dbgen 
			 */
            rndm = (long)((unsigned)time(NULL) * DSS_PROC);
            }
		if (rndm < 0)
			rndm += 2147483647;
		Seed[0].value = rndm;
		for (i=1; i <= QUERIES_PER_SET; i++)
			{
			Seed[0].value = NextRand(Seed[0].value);
			Seed[i].value = Seed[0].value;
			}
		printf("-- using %ld as a seed to the RNG\n", rndm);
		}
    else
        printf("-- using default substitutions\n");
    
    if (flags & INIT)           /* init stream with ifile */
        {
        ifp = fopen(ifile, "r");
	OPEN_CHECK(ifp, ifile);
        while (fgets(line, LINE_SIZE, ifp) != NULL)
            fprintf(stdout, "%s", line);
        }

    if (snum >= 0)
        if (optind < ac)
            for (i=optind; i < ac; i++)
                {
                char qname[10];
                sprintf(qname, "%ld", SEQUENCE(snum, atoi(av[i])));
                qsub(qname, flags);
                }
        else
            for (i=1; i <= QUERIES_PER_SET; i++)
                {
                char qname[10];
                sprintf(qname, "%ld", SEQUENCE(snum, i));
                qsub(qname, flags);
                }
    else
        if (optind < ac)
            for (i=optind; i < ac; i++)
                qsub(av[i], flags);   
        else
            for (i=1; i <= QUERIES_PER_SET; i++)
                {
                char qname[10];
                sprintf(qname, "%d", i);
                qsub(qname, flags);
                }
    
    if (flags & TERMINATE)      /* terminate stream with tfile */
        {
        ifp = fopen(tfile, "r");
        if (ifp == NULL)
	OPEN_CHECK(ifp, tfile);
        while (fgets(line, LINE_SIZE, ifp) != NULL)
            fprintf(stdout, "%s", line);
        }

    return(0);
}